

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepTiledInputFile::rawTileData
          (DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char *pixelData,
          uint64_t *pixelDataSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  pthread_mutex_t *__mutex;
  IStream *pIVar5;
  ulong uVar6;
  InputStreamMutex *pIVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  uint64_t *puVar12;
  undefined4 extraout_var;
  Data *pDVar13;
  ulong uVar14;
  InputExc *pIVar15;
  ostream *poVar16;
  ArgExc *pAVar17;
  stringstream _iex_throw_s;
  undefined4 uStack_1b4;
  ostream local_1a8 [376];
  
  iVar11 = *dx;
  iVar1 = *dy;
  iVar2 = *lx;
  iVar3 = *ly;
  bVar10 = isValidTile(this,iVar11,iVar1,iVar2,iVar3);
  if (!bVar10) {
    pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar17,"Tried to read a tile outside the image file\'s data window.");
    __cxa_throw(pAVar17,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  puVar12 = TileOffsets::operator()(&this->_data->tileOffsets,iVar11,iVar1,iVar2,iVar3);
  uVar4 = *puVar12;
  if (uVar4 != 0) {
    __mutex = (pthread_mutex_t *)this->_data->_streamData;
    std::mutex::lock((mutex *)&__mutex->__data);
    iVar11 = (*this->_data->_streamData->is->_vptr_IStream[5])();
    if (CONCAT44(extraout_var,iVar11) != uVar4) {
      pIVar5 = this->_data->_streamData->is;
      (*pIVar5->_vptr_IStream[6])(pIVar5,uVar4);
    }
    pDVar13 = this->_data;
    if ((pDVar13->version & 0x1000) != 0) {
      pIVar5 = pDVar13->_streamData->is;
      (*pIVar5->_vptr_IStream[3])(pIVar5,&_iex_throw_s,4);
      pDVar13 = this->_data;
      if (__iex_throw_s != pDVar13->partNumber) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar16 = std::operator<<(local_1a8,"Unexpected part number ");
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,__iex_throw_s);
        poVar16 = std::operator<<(poVar16,", should be ");
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,this->_data->partNumber);
        std::operator<<(poVar16,".");
        pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar17,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar17,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    pIVar5 = pDVar13->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&_iex_throw_s,4);
    iVar11 = __iex_throw_s;
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&_iex_throw_s,4);
    iVar1 = __iex_throw_s;
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&_iex_throw_s,4);
    iVar2 = __iex_throw_s;
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&_iex_throw_s,4);
    iVar3 = __iex_throw_s;
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&_iex_throw_s,8);
    lVar8 = CONCAT44(uStack_1b4,__iex_throw_s);
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&_iex_throw_s,8);
    if (iVar11 == *dx) {
      if (iVar1 == *dy) {
        if (iVar2 == *lx) {
          if (iVar3 == *ly) {
            lVar9 = CONCAT44(uStack_1b4,__iex_throw_s);
            uVar14 = lVar9 + lVar8 + 0x28;
            uVar6 = *pixelDataSize;
            *pixelDataSize = uVar14;
            if ((pixelData == (char *)0x0) || (uVar6 < uVar14)) {
              if ((this->_data->version & 0x1000) == 0) {
                pIVar7 = this->_data->_streamData;
                pIVar5 = pIVar7->is;
                (*pIVar5->_vptr_IStream[6])(pIVar5,pIVar7->currentPosition);
              }
            }
            else {
              *(int *)pixelData = iVar11;
              *(int *)(pixelData + 4) = *dy;
              *(int *)(pixelData + 8) = iVar2;
              *(int *)(pixelData + 0xc) = iVar3;
              *(long *)(pixelData + 0x10) = lVar8;
              *(long *)(pixelData + 0x18) = lVar9;
              Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
                        (this->_data->_streamData->is,(uint64_t *)(pixelData + 0x20));
              pIVar5 = this->_data->_streamData->is;
              (*pIVar5->_vptr_IStream[3])(pIVar5,pixelData + 0x28,lVar9 + lVar8 & 0xffffffff);
              if ((this->_data->version & 0x1000) == 0) {
                pIVar7 = this->_data->_streamData;
                pIVar7->currentPosition = pIVar7->currentPosition + lVar9 + lVar8 + 0x28;
              }
            }
            pthread_mutex_unlock(__mutex);
            return;
          }
          pIVar15 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar15,"Unexpected tile y level number coordinate.");
        }
        else {
          pIVar15 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar15,"Unexpected tile x level number coordinate.");
        }
      }
      else {
        pIVar15 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar15,"Unexpected tile y coordinate.");
      }
    }
    else {
      pIVar15 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::InputExc::InputExc(pIVar15,"Unexpected tile x coordinate.");
    }
    __cxa_throw(pIVar15,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar16 = std::operator<<(local_1a8,"Tile (");
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,*dx);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,*dy);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,*lx);
  poVar16 = std::operator<<(poVar16,", ");
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,*ly);
  std::operator<<(poVar16,") is missing.");
  pIVar15 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(pIVar15,(stringstream *)&_iex_throw_s);
  __cxa_throw(pIVar15,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

void
DeepTiledInputFile::rawTileData (
    int&      dx,
    int&      dy,
    int&      lx,
    int&      ly,
    char*     pixelData,
    uint64_t& pixelDataSize) const
{
    if (!isValidTile (dx, dy, lx, ly))
        throw IEX_NAMESPACE::ArgExc ("Tried to read a tile outside "
                                     "the image file's data window.");

    uint64_t tileOffset = _data->tileOffsets (dx, dy, lx, ly);

    if (tileOffset == 0)
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "Tile (" << dx << ", " << dy << ", " << lx << ", " << ly
                     << ") is missing.");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    if (_data->_streamData->is->tellg () != tileOffset)
        _data->_streamData->is->seekg (tileOffset);

    //
    // Read the first few bytes of the tile (the header).
    // Verify that the tile coordinates and the level number
    // are correct.
    //

    int tileXCoord, tileYCoord, levelX, levelY;

    if (isMultiPart (_data->version))
    {
        int partNumber;
        Xdr::read<StreamIO> (*_data->_streamData->is, partNumber);
        if (partNumber != _data->partNumber)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Unexpected part number " << partNumber << ", should be "
                                          << _data->partNumber << ".");
        }
    }

    Xdr::read<StreamIO> (*_data->_streamData->is, tileXCoord);
    Xdr::read<StreamIO> (*_data->_streamData->is, tileYCoord);
    Xdr::read<StreamIO> (*_data->_streamData->is, levelX);
    Xdr::read<StreamIO> (*_data->_streamData->is, levelY);

    uint64_t sampleCountTableSize;
    uint64_t packedDataSize;
    Xdr::read<StreamIO> (*_data->_streamData->is, sampleCountTableSize);

    Xdr::read<StreamIO> (*_data->_streamData->is, packedDataSize);

    if (tileXCoord != dx)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

    if (tileYCoord != dy)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

    if (levelX != lx)
        throw IEX_NAMESPACE::InputExc (
            "Unexpected tile x level number coordinate.");

    if (levelY != ly)
        throw IEX_NAMESPACE::InputExc (
            "Unexpected tile y level number coordinate.");

    // total requirement for reading all the data

    uint64_t totalSizeRequired = 40 + sampleCountTableSize + packedDataSize;

    bool big_enough = totalSizeRequired <= pixelDataSize;

    pixelDataSize = totalSizeRequired;

    // was the block we were given big enough?
    if (!big_enough || pixelData == NULL)
    {
        // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
        // in single part files)
        if (!isMultiPart (_data->version))
        {
            _data->_streamData->is->seekg (_data->_streamData->currentPosition);
        }
        // leave lock here - bail before reading more data
        return;
    }

    // copy the values we have read into the output block
    *(int*) (pixelData + 0)       = dx;
    *(int*) (pixelData + 4)       = dy;
    *(int*) (pixelData + 8)       = levelX;
    *(int*) (pixelData + 12)      = levelY;
    *(uint64_t*) (pixelData + 16) = sampleCountTableSize;
    *(uint64_t*) (pixelData + 24) = packedDataSize;

    // didn't read the unpackedsize - do that now
    Xdr::read<StreamIO> (
        *_data->_streamData->is, *(uint64_t*) (pixelData + 32));

    // read the actual data
    _data->_streamData->is->read (
        pixelData + 40,
        static_cast<int> (sampleCountTableSize + packedDataSize));

    if (!isMultiPart (_data->version))
    {
        _data->_streamData->currentPosition +=
            sampleCountTableSize + packedDataSize + 40;
    }

    // leave lock here
}